

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O1

string * miniros::names::parentNamespace(string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  runtime_error *this;
  string stripped_name;
  string error;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar1 = validate(name,&local_60);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
      }
      else {
        local_78 = 0;
        local_70 = 0;
        local_80 = &local_70;
        lVar3 = std::__cxx11::string::rfind((char)name,0x2f);
        if (lVar3 == name->_M_string_length - 1) {
          std::__cxx11::string::substr((ulong)local_40,(ulong)name);
          std::__cxx11::string::operator=((string *)&local_80,(string *)local_40);
          if (local_40[0] != local_30) {
            operator_delete(local_40[0],local_30[0] + 1);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_80);
        }
        lVar3 = std::__cxx11::string::rfind((char)&local_80,0x2f);
        if (lVar3 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
        }
        else if (lVar3 == -1) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        }
        else {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_80);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&local_60);
  *(undefined ***)this = &PTR__runtime_error_002abdd8;
  __cxa_throw(this,&InvalidNameException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string parentNamespace(const std::string& name)
{
  std::string error;
  if (!validate(name, error))
  {
  	throw InvalidNameException(error);
  }

  if (!name.compare(""))  return "";
  if (!name.compare("/")) return "/"; 

  std::string stripped_name;

  // rstrip trailing slash
  if (name.find_last_of('/') == name.size()-1)
    stripped_name = name.substr(0, name.size() -2);
  else
    stripped_name = name;

  //pull everything up to the last /
  size_t last_pos = stripped_name.find_last_of('/');
  if (last_pos == std::string::npos)
  {
    return "";
  }
  else if (last_pos == 0)
    return "/";
  return stripped_name.substr(0, last_pos);
}